

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r20_conv.cpp
# Opt level: O1

precise_unit units::r20_unit(string *r20_string)

{
  char *__s2;
  int iVar1;
  difference_type __d;
  ulong uVar2;
  ulong uVar4;
  qword qVar5;
  undefined1 *puVar6;
  double dVar7;
  precise_unit pVar8;
  ulong uVar3;
  
  __s2 = (r20_string->_M_dataplus)._M_p;
  puVar6 = precise::r20_units;
  uVar3 = 0x828;
  do {
    uVar2 = uVar3 >> 1;
    iVar1 = strcmp((char *)((Elf64_Dyn *)((long)puVar6 + (uVar2 * 2 + 1) * 0x10))->d_val,__s2);
    uVar4 = uVar2;
    if (iVar1 < 0) {
      uVar4 = ~uVar2 + uVar3;
      puVar6 = (undefined1 *)((long)puVar6 + (uVar2 * 2 + 2) * 0x10);
    }
    uVar3 = uVar4;
  } while (0 < (long)uVar4);
  qVar5 = 0xfa94a488;
  dVar7 = NAN;
  if ((Elf64_Dyn *)puVar6 != _DYNAMIC) {
    iVar1 = strcmp((char *)((Elf64_Dyn *)((long)puVar6 + 0x10))->d_val,__s2);
    dVar7 = NAN;
    if (iVar1 == 0) {
      dVar7 = (double)((Elf64_Dyn *)puVar6)->d_tag;
      qVar5 = ((Elf64_Dyn *)puVar6)->d_val;
    }
  }
  pVar8.base_units_ = (unit_data)(int)qVar5;
  pVar8.commodity_ = (int)(qVar5 >> 0x20);
  pVar8.multiplier_ = dVar7;
  return pVar8;
}

Assistant:

precise_unit r20_unit(const std::string& r20_string)
{
    // NOLINTNEXTLINE (readability-qualified-auto)
    auto ind = std::lower_bound(
        precise::r20_units.begin(),
        precise::r20_units.end(),
        r20_string,
        [](const precise::unitD& u_set, const std::string& val) {
            return (strcmp(std::get<0>(u_set), val.c_str()) < 0);
        });
    if (ind == precise::r20_units.end()) {
        return precise::invalid;
    }
    if (strcmp(std::get<0>(*ind), r20_string.c_str()) == 0) {
        return std::get<2>(*ind);
    }
    return precise::invalid;
}